

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span-main.t.hpp
# Opt level: O3

ostream * nonstd::span_lite::operator<<(ostream *os,span<unsigned_char,_18446744073709551615UL> *v)

{
  size_type sVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  lest *plVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ostream *poVar5;
  size_type *psVar6;
  char *chr;
  size_type sVar7;
  lest local_79;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  string local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[span:",6);
  sVar1 = v->size_;
  if (sVar1 == 0) {
    local_78 = &aStack_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"[empty]","");
    sVar7 = local_70;
    paVar4 = &local_58.field_2;
    if (local_78 == &aStack_68) {
      local_58.field_2._8_8_ = aStack_68._8_8_;
      local_78 = paVar4;
    }
    local_70 = 0;
    aStack_68._M_allocated_capacity = aStack_68._M_allocated_capacity & 0xffffffffffffff00;
    if (local_78 == paVar4) {
      local_28._8_8_ = local_58.field_2._8_8_;
      local_78 = &local_28;
    }
    psVar6 = &local_58._M_string_length;
    local_58._M_dataplus._M_p = (pointer)paVar4;
    local_38 = local_78;
    goto LAB_001cda40;
  }
  plVar3 = (lest *)span<unsigned_char,_18446744073709551615UL>::operator[](v,0);
  local_79 = *plVar3;
  lest::to_string_abi_cxx11_(&local_58,&local_79,chr);
  paVar4 = &aStack_68;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == &local_58.field_2) {
    aStack_68._8_8_ = local_58.field_2._8_8_;
LAB_001cd9d3:
    local_38 = &local_28;
    local_28._8_8_ = aStack_68._8_8_;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == paVar4) goto LAB_001cd9d3;
    local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_58._M_dataplus._M_p;
  }
  aStack_68._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
  local_70 = local_58._M_string_length;
  psVar6 = &local_70;
  sVar7 = local_58._M_string_length;
LAB_001cda40:
  paVar2 = local_38;
  local_78 = &aStack_68;
  *psVar6 = 0;
  paVar4->_M_local_buf[0] = '\0';
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,paVar2->_M_local_buf,sVar7);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
  if (local_38 != &local_28) {
    operator_delete(local_38);
  }
  if ((sVar1 == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2)) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_78 != &aStack_68) {
    operator_delete(local_78);
  }
  return poVar5;
}

Assistant:

inline std::ostream & operator<<( std::ostream & os, span<T> const & v )
{
    using lest::to_string;
    return os << "[span:" << (v.empty() ? "[empty]" : to_string( v[0] ) ) << "]";
}